

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O2

bool __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readMPS(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,istream *p_input,NameSet *p_rnames,NameSet *p_cnames,DIdxSet *p_intvars)

{
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_00;
  uint *puVar1;
  char cVar2;
  Verbosity VVar3;
  pointer pnVar4;
  double dVar5;
  char *pcVar6;
  NameSet *this_01;
  bool bVar7;
  type_conflict5 tVar8;
  int iVar9;
  uint uVar10;
  double *pdVar11;
  ostream *poVar12;
  SPxOut *pSVar13;
  pointer pnVar14;
  SPxOut *pSVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  char *pcVar16;
  NameSet *pNVar17;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  NameSet *local_710;
  NameSet *local_708;
  Verbosity old_verbosity_1;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  uint local_6f0;
  uint uStack_6ec;
  uint uStack_6e8;
  uint uStack_6e4;
  uint local_6e0 [2];
  int local_6d8;
  bool local_6d4;
  fpclass_type local_6d0;
  int32_t iStack_6cc;
  DIdxSet *local_6c8;
  SPxOut *local_6c0;
  Verbosity old_verbosity;
  uint uStack_6b4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_6b0;
  undefined8 local_6a8;
  uint uStack_6a0;
  uint uStack_69c;
  uint local_698;
  undefined3 uStack_693;
  int local_690;
  bool local_68c;
  undefined8 local_688;
  Verbosity local_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  uint local_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  uint local_660 [2];
  int local_658;
  bool local_654;
  fpclass_type local_650;
  int32_t iStack_64c;
  _func_int **local_648;
  uint auStack_640 [2];
  uint local_638 [2];
  uint auStack_630 [2];
  uint local_628 [2];
  int local_620;
  bool local_61c;
  fpclass_type local_618;
  int32_t iStack_614;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_610 [3];
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_5b0;
  SPxOut *local_5a8;
  NameSet *local_5a0;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  vec;
  char colname [256];
  MPSInput local_448;
  _func_int **local_e8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_e0;
  int local_d8;
  int iStack_d4;
  undefined8 uStack_d0;
  undefined8 local_c8;
  int local_c0;
  char local_bc;
  fpclass_type local_b8;
  int32_t iStack_b4;
  _func_int **local_a8;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_a0;
  int local_98;
  int iStack_94;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  char local_7c;
  fpclass_type local_78;
  int32_t iStack_74;
  _func_int **local_68;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNStack_60;
  int local_58;
  int iStack_54;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  char local_3c;
  fpclass_type local_38;
  int32_t iStack_34;
  
  local_6c8 = p_intvars;
  local_5a0 = p_cnames;
  if (p_cnames == (NameSet *)0x0) {
    local_710 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_710,1);
    p_cnames = local_710;
    NameSet::NameSet(local_710,10000,-1,2.0,2.0);
  }
  local_710 = p_cnames;
  NameSet::clear(p_cnames);
  pNVar17 = p_rnames;
  if (p_rnames == (NameSet *)0x0) {
    local_708 = (NameSet *)0x0;
    spx_alloc<soplex::NameSet*>(&local_708,1);
    pNVar17 = local_708;
    NameSet::NameSet(local_708,10000,-1,2.0,2.0);
  }
  this_00 = &this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ;
  local_708 = pNVar17;
  NameSet::clear(pNVar17);
  clear(this);
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::memRemax(&this_00->
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,100000);
  local_5b0 = this_00;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::reMax(this_00,10000);
  local_448._vptr_MPSInput = (_func_int **)&PTR__MPSInput_00332740;
  local_448.m_section = NAME;
  local_448.m_lineno = 0;
  local_448.m_objsense = MINIMIZE;
  local_448.m_has_error = false;
  local_448.m_buf[0] = '\0';
  local_448.m_is_integer = false;
  local_448.m_is_new_format = false;
  local_448.m_ignored = 0;
  local_448.m_objname[0] = '\0';
  local_448.m_f0 = (char *)0x0;
  local_448.m_f1 = (char *)0x0;
  local_448.m_f2 = (char *)0x0;
  local_448.m_f3 = (char *)0x0;
  local_448.m_f4 = (char *)0x0;
  local_448.m_f5 = (char *)0x0;
  local_448.m_probname[0] = '\0';
  local_448.m_input = p_input;
  MPSreadName(&local_448,this->spxout);
  if (local_448.m_section == OBJSEN) {
    MPSreadObjsen(&local_448);
  }
  if (local_448.m_section == OBJNAME) {
    MPSreadObjname(&local_448);
  }
  pNVar17 = local_708;
  if (local_448.m_section == ROWS) {
    pSVar15 = this->spxout;
    LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPRowBase((LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)colname,0);
    while (bVar7 = MPSInput::readLine(&local_448), bVar7) {
      if (local_448.m_f0 != (char *)0x0) {
        if ((pSVar15 != (SPxOut *)0x0) && (3 < (int)pSVar15->m_verbosity)) {
          _old_verbosity = (_func_int **)CONCAT44(uStack_6b4,pSVar15->m_verbosity);
          val.m_backend.data._M_elems[0] = 4;
          (*pSVar15->_vptr_SPxOut[2])(pSVar15);
          pSVar13 = soplex::operator<<(pSVar15,"IMPSRD02 Objective name : ");
          pSVar13 = soplex::operator<<(pSVar13,local_448.m_objname);
          std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&old_verbosity);
        }
        iVar9 = strcmp(local_448.m_f0,"COLUMNS");
        if (iVar9 == 0) {
          local_448.m_section = COLUMNS;
          goto LAB_0020df51;
        }
        break;
      }
      if ((local_448.m_f1 == (char *)0x0) || (local_448.m_f2 == (char *)0x0)) break;
      if (*local_448.m_f1 == 'N') {
        if (local_448.m_objname[0] == '\0') {
          MPSInput::setObjName(&local_448,local_448.m_f2);
        }
      }
      else {
        bVar7 = NameSet::has(pNVar17,local_448.m_f2);
        if (bVar7) break;
        NameSet::add(pNVar17,local_448.m_f2);
        cVar2 = *local_448.m_f1;
        if (cVar2 == 'E') {
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
          colname._16_8_ = local_6a8;
          colname._0_8_ = _old_verbosity;
          colname._8_8_ = pNStack_6b0;
          colname[0x28] = (undefined1)local_690;
          colname[0x29] = local_690._1_1_;
          colname[0x2a] = local_690._2_1_;
          colname[0x2b] = local_690._3_1_;
          colname[0x2c] = local_68c;
          colname._48_8_ = local_688;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
        }
        else if (cVar2 == 'L') {
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,-*pdVar11,(type *)0x0);
          colname._16_8_ = local_6a8;
          colname._0_8_ = _old_verbosity;
          colname._8_8_ = pNStack_6b0;
          colname[0x28] = (undefined1)local_690;
          colname[0x29] = local_690._1_1_;
          colname[0x2a] = local_690._2_1_;
          colname[0x2b] = local_690._3_1_;
          colname[0x2c] = local_68c;
          colname._48_8_ = local_688;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
        }
        else {
          if (cVar2 != 'G') break;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,0.0,(type *)0x0);
          colname._16_4_ = (int)local_6a8;
          colname._20_4_ = local_6a8._4_4_;
          colname._0_8_ = _old_verbosity;
          colname._8_8_ = pNStack_6b0;
          colname[0x28] = (undefined1)local_690;
          colname[0x29] = local_690._1_1_;
          colname[0x2a] = local_690._2_1_;
          colname[0x2b] = local_690._3_1_;
          colname[0x2c] = local_68c;
          colname._48_8_ = local_688;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity,*pdVar11,(type *)0x0);
        }
        colname._72_8_ = local_6a8;
        colname._56_8_ = _old_verbosity;
        colname._64_8_ = pNStack_6b0;
        colname[0x60] = (undefined1)local_690;
        colname[0x61] = local_690._1_1_;
        colname[0x62] = local_690._2_1_;
        colname[99] = local_690._3_1_;
        colname[100] = local_68c;
        colname._104_8_ = local_688;
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::add(&this->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)colname);
      }
    }
    MPSInput::syntaxError(&local_448);
LAB_0020df51:
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~DSVectorBase((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)(colname + 0xa8));
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])();
  this_01 = local_708;
  pNVar17 = local_710;
  if (local_448.m_section == COLUMNS) {
    val.m_backend.fpclass = cpp_dec_float_finite;
    val.m_backend.prec_elem = 10;
    val.m_backend.data._M_elems[0] = 0;
    val.m_backend.data._M_elems[1] = 0;
    val.m_backend.data._M_elems[2] = 0;
    val.m_backend.data._M_elems[3] = 0;
    val.m_backend.data._M_elems[4] = 0;
    val.m_backend.data._M_elems[5] = 0;
    val.m_backend.data._M_elems[6] = 0;
    val.m_backend.data._M_elems[7] = 0;
    val.m_backend.data._M_elems._32_5_ = 0;
    val.m_backend.data._M_elems[9]._1_3_ = 0;
    val.m_backend.exp = 0;
    val.m_backend.neg = false;
    memset(colname,0,0x100);
    LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::LPColBase((LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&old_verbosity,
                (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum);
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::DSVectorBase(&vec,8);
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,0.0,(type *)0x0);
    local_628[0] = local_6e0[0];
    local_628[1] = local_6e0[1];
    auStack_640[1] = uStack_6f4;
    auStack_640[0] = uStack_6f8;
    local_638[1] = uStack_6ec;
    local_638[0] = local_6f0;
    auStack_630[1] = uStack_6e4;
    auStack_630[0] = uStack_6e8;
    local_648 = _old_verbosity_1;
    local_620 = local_6d8;
    local_61c = local_6d4;
    vec.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    local_618 = local_6d0;
    iStack_614 = iStack_6cc;
    while (bVar7 = MPSInput::readLine(&local_448), pcVar16 = local_448.m_f1, bVar7) {
      if (local_448.m_f0 != (char *)0x0) {
        iVar9 = strcmp(local_448.m_f0,"RHS");
        if (iVar9 == 0) {
          if (colname[0] != '\0') {
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                         *)local_610,
                        &vec.
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       );
            LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(local_5b0,
                  (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)&old_verbosity);
          }
          local_448.m_section = RHS;
          goto LAB_0020e533;
        }
        break;
      }
      if (((local_448.m_f1 == (char *)0x0) || (local_448.m_f2 == (char *)0x0)) ||
         (local_448.m_f3 == (char *)0x0)) break;
      iVar9 = strcmp(colname,local_448.m_f1);
      if (iVar9 != 0) {
        if (colname[0] != '\0') {
          DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::operator=((DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       *)local_610,
                      &vec.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     );
          LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::add(local_5b0,
                (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&old_verbosity);
          pcVar16 = local_448.m_f1;
        }
        spxSnprintf(colname,0xff,"%s",pcVar16);
        colname[0xff] = '\0';
        iVar9 = (pNVar17->set).thesize;
        NameSet::add(pNVar17,colname);
        if ((pNVar17->set).thesize <= iVar9) {
          poVar12 = std::operator<<((ostream *)&std::cerr,
                                    "ERROR in COLUMNS: duplicate column name or not column-wise ordering"
                                   );
          std::endl<char,std::char_traits<char>>(poVar12);
          break;
        }
        vec.
        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ._8_8_ = vec.
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ._8_8_ & 0xffffffff;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,0.0,(type *)0x0);
        local_628[0] = local_6e0[0];
        local_628[1] = local_6e0[1];
        auStack_640[1] = uStack_6f4;
        auStack_640[0] = uStack_6f8;
        local_638[1] = uStack_6ec;
        local_638[0] = local_6f0;
        auStack_630[1] = uStack_6e4;
        auStack_630[0] = uStack_6e8;
        local_648 = _old_verbosity_1;
        local_620 = local_6d8;
        local_61c = local_6d4;
        local_618 = local_6d0;
        iStack_614 = iStack_6cc;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,0.0,(type *)0x0);
        local_660[0] = local_6e0[0];
        local_660[1] = local_6e0[1];
        local_670 = local_6f0;
        uStack_66c = uStack_6ec;
        uStack_668 = uStack_6e8;
        uStack_664 = uStack_6e4;
        local_680 = old_verbosity_1;
        uStack_67c = uStack_6fc;
        uStack_678 = uStack_6f8;
        uStack_674 = uStack_6f4;
        local_658 = local_6d8;
        local_654 = local_6d4;
        local_650 = local_6d0;
        iStack_64c = iStack_6cc;
        pdVar11 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,*pdVar11,(type *)0x0);
        _local_698 = local_6e0._0_5_;
        uStack_693 = local_6e0[1]._1_3_;
        pNStack_6b0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(uStack_6f4,uStack_6f8);
        local_6a8._4_4_ = uStack_6ec;
        local_6a8._0_4_ = local_6f0;
        uStack_6a0 = uStack_6e8;
        uStack_69c = uStack_6e4;
        _old_verbosity = _old_verbosity_1;
        local_690 = local_6d8;
        local_68c = local_6d4;
        local_688._0_4_ = local_6d0;
        local_688._4_4_ = iStack_6cc;
        if (local_448.m_is_integer == true) {
          if (local_6c8 != (DIdxSet *)0x0) {
            iVar9 = NameSet::number(pNVar17,colname);
            DIdxSet::addIdx(local_6c8,iVar9);
          }
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,1.0,(type *)0x0);
          _local_698 = local_6e0._0_5_;
          uStack_693 = local_6e0[1]._1_3_;
          pNStack_6b0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(uStack_6f4,uStack_6f8);
          local_6a8._4_4_ = uStack_6ec;
          local_6a8._0_4_ = local_6f0;
          uStack_6a0 = uStack_6e8;
          uStack_69c = uStack_6e4;
          _old_verbosity = _old_verbosity_1;
          local_690 = local_6d8;
          local_68c = local_6d4;
          local_688._0_4_ = local_6d0;
          local_688._4_4_ = iStack_6cc;
        }
      }
      dVar5 = atof(local_448.m_f3);
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&val,dVar5);
      pcVar16 = local_448.m_f2;
      iVar9 = strcmp(local_448.m_f2,local_448.m_objname);
      if (iVar9 == 0) {
        local_628[1]._1_3_ = val.m_backend.data._M_elems[9]._1_3_;
        local_628._0_5_ = val.m_backend.data._M_elems._32_5_;
        auStack_630[1] = val.m_backend.data._M_elems[7];
        auStack_630[0] = val.m_backend.data._M_elems[6];
        local_638[0] = val.m_backend.data._M_elems[4];
        local_638[1] = val.m_backend.data._M_elems[5];
        local_648 = (_func_int **)val.m_backend.data._M_elems._0_8_;
        auStack_640[0] = val.m_backend.data._M_elems[2];
        auStack_640[1] = val.m_backend.data._M_elems[3];
        local_620 = val.m_backend.exp;
        local_61c = val.m_backend.neg;
        local_618 = val.m_backend.fpclass;
        iStack_614 = val.m_backend.prec_elem;
      }
      else {
        iVar9 = NameSet::number(this_01,pcVar16);
        if (iVar9 < 0) {
          MPSInput::entryIgnored(&local_448,"Column",local_448.m_f1,"row",local_448.m_f2);
        }
        else {
          _old_verbosity_1 = (_func_int **)0x0;
          tVar8 = boost::multiprecision::operator!=(&val,(double *)&old_verbosity_1);
          if (tVar8) {
            DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(&vec,iVar9,&val);
          }
        }
      }
      if (local_448.m_f5 != (char *)0x0) {
        dVar5 = atof(local_448.m_f5);
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&val,dVar5);
        pcVar16 = local_448.m_f4;
        iVar9 = strcmp(local_448.m_f4,local_448.m_objname);
        if (iVar9 == 0) {
          local_628[1]._1_3_ = val.m_backend.data._M_elems[9]._1_3_;
          local_628._0_5_ = val.m_backend.data._M_elems._32_5_;
          local_648 = (_func_int **)val.m_backend.data._M_elems._0_8_;
          auStack_630[1] = val.m_backend.data._M_elems[7];
          auStack_630[0] = val.m_backend.data._M_elems[6];
          local_638[0] = val.m_backend.data._M_elems[4];
          local_638[1] = val.m_backend.data._M_elems[5];
          auStack_640[0] = val.m_backend.data._M_elems[2];
          auStack_640[1] = val.m_backend.data._M_elems[3];
          local_620 = val.m_backend.exp;
          local_61c = val.m_backend.neg;
          local_618 = val.m_backend.fpclass;
          iStack_614 = val.m_backend.prec_elem;
        }
        else {
          iVar9 = NameSet::number(this_01,pcVar16);
          if (iVar9 < 0) {
            MPSInput::entryIgnored(&local_448,"Column",local_448.m_f1,"row",local_448.m_f4);
          }
          else {
            _old_verbosity_1 = (_func_int **)0x0;
            tVar8 = boost::multiprecision::operator!=(&val,(double *)&old_verbosity_1);
            if (tVar8) {
              DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::add(&vec,iVar9,&val);
            }
          }
        }
      }
    }
    MPSInput::syntaxError(&local_448);
LAB_0020e533:
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~DSVectorBase(&vec);
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~DSVectorBase(local_610);
  }
  pNVar17 = local_708;
  if (local_448.m_section == RHS) {
    pSVar15 = this->spxout;
    memset(colname,0,0x100);
    memset(&old_verbosity,0,0x100);
    val.m_backend.fpclass = cpp_dec_float_finite;
    val.m_backend.prec_elem = 10;
    val.m_backend.data._M_elems[0] = 0;
    val.m_backend.data._M_elems[1] = 0;
    val.m_backend.data._M_elems[2] = 0;
    val.m_backend.data._M_elems[3] = 0;
    val.m_backend.data._M_elems[4] = 0;
    val.m_backend.data._M_elems[5] = 0;
    val.m_backend.data._M_elems[6] = 0;
    val.m_backend.data._M_elems[7] = 0;
    val.m_backend.data._M_elems._32_5_ = 0;
    val.m_backend.data._M_elems[9]._1_3_ = 0;
    val.m_backend.exp = 0;
    val.m_backend.neg = false;
    while (bVar7 = MPSInput::readLine(&local_448), bVar7) {
      if (local_448.m_f0 != (char *)0x0) {
        if ((pSVar15 != (SPxOut *)0x0) && (3 < (int)pSVar15->m_verbosity)) {
          _old_verbosity_1 = (_func_int **)CONCAT44(uStack_6fc,pSVar15->m_verbosity);
          vec._vptr_DSVectorBase = (_func_int **)CONCAT44(vec._vptr_DSVectorBase._4_4_,4);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15);
          pSVar13 = soplex::operator<<(pSVar15,"IMPSRD03 RHS name       : ");
          pSVar13 = soplex::operator<<(pSVar13,colname);
          std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&old_verbosity_1);
        }
        pcVar16 = local_448.m_f0;
        iVar9 = strcmp(local_448.m_f0,"RANGES");
        if (iVar9 == 0) {
          local_448.m_section = RANGES;
          goto LAB_0020eb0d;
        }
        iVar9 = strcmp(pcVar16,"BOUNDS");
        if (iVar9 == 0) {
          local_448.m_section = BOUNDS;
          goto LAB_0020eb0d;
        }
        iVar9 = strcmp(pcVar16,"ENDATA");
        if (iVar9 == 0) {
          local_448.m_section = ENDATA;
          goto LAB_0020eb0d;
        }
        break;
      }
      if ((local_448.m_f2 != (char *)0x0 && local_448.m_f3 == (char *)0x0) ||
         ((local_448.m_f4 != (char *)0x0 && (local_448.m_f5 == (char *)0x0)))) {
        MPSInput::insertName(&local_448,"_RHS_",false);
      }
      if (((local_448.m_f1 == (char *)0x0) || (local_448.m_f2 == (char *)0x0)) ||
         (local_448.m_f3 == (char *)0x0)) break;
      if (colname[0] == '\0') {
        spxSnprintf(colname,0x100,"%s",local_448.m_f1);
      }
      pcVar16 = local_448.m_f1;
      iVar9 = strcmp(colname,local_448.m_f1);
      if (iVar9 == 0) {
        uVar10 = NameSet::number(pNVar17,local_448.m_f2);
        if ((int)uVar10 < 0) {
          MPSInput::entryIgnored(&local_448,"RHS",local_448.m_f1,"row",local_448.m_f2);
        }
        else {
          dVar5 = atof(local_448.m_f3);
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&val,dVar5);
          pnVar14 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).right.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,*pdVar11,(type *)0x0);
          tVar8 = boost::multiprecision::operator<
                            (pnVar14 + uVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&old_verbosity_1);
          if (tVar8) {
            pnVar4 = (this->
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).right.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)(pnVar4[uVar10].m_backend.data._M_elems + 8) =
                 CONCAT35(val.m_backend.data._M_elems[9]._1_3_,val.m_backend.data._M_elems._32_5_);
            puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT44(val.m_backend.data._M_elems[7],val.m_backend.data._M_elems[6]);
            pnVar14 = pnVar4 + uVar10;
            (pnVar14->m_backend).data._M_elems[0] = val.m_backend.data._M_elems[0];
            (pnVar14->m_backend).data._M_elems[1] = val.m_backend.data._M_elems[1];
            (pnVar14->m_backend).data._M_elems[2] = val.m_backend.data._M_elems[2];
            (pnVar14->m_backend).data._M_elems[3] = val.m_backend.data._M_elems[3];
            pnVar4[uVar10].m_backend.exp = val.m_backend.exp;
            pnVar4[uVar10].m_backend.neg = val.m_backend.neg;
            pnVar4[uVar10].m_backend.fpclass = val.m_backend.fpclass;
            pnVar4[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
          }
          pnVar14 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,-*pdVar11,(type *)0x0);
          tVar8 = boost::multiprecision::operator>
                            (pnVar14 + uVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&old_verbosity_1);
          if (tVar8) {
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)(pnVar14[uVar10].m_backend.data._M_elems + 8) =
                 CONCAT35(val.m_backend.data._M_elems[9]._1_3_,val.m_backend.data._M_elems._32_5_);
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT44(val.m_backend.data._M_elems[7],val.m_backend.data._M_elems[6]);
            *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                 val.m_backend.data._M_elems._8_8_;
            pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
            pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
            pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
            pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
          }
        }
        if (local_448.m_f5 != (char *)0x0) {
          uVar10 = NameSet::number(pNVar17,local_448.m_f4);
          if ((int)uVar10 < 0) {
            MPSInput::entryIgnored(&local_448,"RHS",local_448.m_f1,"row",local_448.m_f4);
          }
          else {
            dVar5 = atof(local_448.m_f5);
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&val,dVar5);
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,*pdVar11,(type *)0x0);
            tVar8 = boost::multiprecision::operator<
                              (pnVar14 + uVar10,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&old_verbosity_1);
            if (tVar8) {
              pnVar4 = (this->
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).right.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)(pnVar4[uVar10].m_backend.data._M_elems + 8) =
                   CONCAT35(val.m_backend.data._M_elems[9]._1_3_,val.m_backend.data._M_elems._32_5_)
              ;
              puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT44(val.m_backend.data._M_elems[7],val.m_backend.data._M_elems[6]);
              pnVar14 = pnVar4 + uVar10;
              (pnVar14->m_backend).data._M_elems[0] = val.m_backend.data._M_elems[0];
              (pnVar14->m_backend).data._M_elems[1] = val.m_backend.data._M_elems[1];
              (pnVar14->m_backend).data._M_elems[2] = val.m_backend.data._M_elems[2];
              (pnVar14->m_backend).data._M_elems[3] = val.m_backend.data._M_elems[3];
              pnVar4[uVar10].m_backend.exp = val.m_backend.exp;
              pnVar4[uVar10].m_backend.neg = val.m_backend.neg;
              pnVar4[uVar10].m_backend.fpclass = val.m_backend.fpclass;
              pnVar4[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
            }
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,-*pdVar11,(type *)0x0);
            tVar8 = boost::multiprecision::operator>
                              (pnVar14 + uVar10,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&old_verbosity_1);
            if (tVar8) {
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)(pnVar14[uVar10].m_backend.data._M_elems + 8) =
                   CONCAT35(val.m_backend.data._M_elems[9]._1_3_,val.m_backend.data._M_elems._32_5_)
              ;
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT44(val.m_backend.data._M_elems[7],val.m_backend.data._M_elems[6]);
              *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
              *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                   val.m_backend.data._M_elems._8_8_;
              pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
              pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
              pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
              pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
            }
          }
        }
      }
      else {
        iVar9 = strcmp((char *)&old_verbosity,pcVar16);
        if (((iVar9 != 0) &&
            (spxSnprintf((char *)&old_verbosity,0x100,"%s",pcVar16), pSVar15 != (SPxOut *)0x0)) &&
           (4 < (int)pSVar15->m_verbosity)) {
          _old_verbosity_1 = (_func_int **)CONCAT44(uStack_6fc,pSVar15->m_verbosity);
          vec._vptr_DSVectorBase = (_func_int **)CONCAT44(vec._vptr_DSVectorBase._4_4_,5);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&vec);
          pSVar13 = soplex::operator<<(pSVar15,"IMPSRD07 RHS ignored    : ");
          pSVar13 = soplex::operator<<(pSVar13,(char *)&old_verbosity);
          std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15);
        }
      }
    }
    MPSInput::syntaxError(&local_448);
  }
LAB_0020eb0d:
  pNVar17 = local_708;
  if (local_448.m_section == RANGES) {
    pSVar15 = this->spxout;
    memset(colname,0,0x100);
    local_688._0_4_ = cpp_dec_float_finite;
    local_688._4_4_ = 10;
    _old_verbosity = (_func_int **)0x0;
    pNStack_6b0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    local_6a8._0_4_ = 0;
    local_6a8._4_4_ = 0;
    uStack_6a0 = 0;
    uStack_69c = 0;
    _local_698 = 0;
    uStack_693 = 0;
    local_690 = 0;
    local_68c = false;
    local_6c0 = (SPxOut *)
                &(this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).right;
    local_5a8 = (SPxOut *)
                &(this->
                 super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).left;
LAB_0020eb9a:
    bVar7 = MPSInput::readLine(&local_448);
    if (bVar7) {
      if (local_448.m_f0 != (char *)0x0) {
        if ((pSVar15 != (SPxOut *)0x0) && (3 < (int)pSVar15->m_verbosity)) {
          val.m_backend.data._M_elems[0] = pSVar15->m_verbosity;
          _old_verbosity_1 = (_func_int **)CONCAT44(uStack_6fc,4);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15);
          pSVar13 = soplex::operator<<(pSVar15,"IMPSRD04 Range name     : ");
          pSVar13 = soplex::operator<<(pSVar13,colname);
          std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&val);
        }
        pcVar16 = local_448.m_f0;
        iVar9 = strcmp(local_448.m_f0,"BOUNDS");
        if (iVar9 == 0) {
          local_448.m_section = BOUNDS;
          goto LAB_0020f32f;
        }
        iVar9 = strcmp(pcVar16,"ENDATA");
        if (iVar9 == 0) {
          local_448.m_section = ENDATA;
          goto LAB_0020f32f;
        }
        goto LAB_0020f31b;
      }
      if ((local_448.m_f2 != (char *)0x0 && local_448.m_f3 == (char *)0x0) ||
         ((local_448.m_f4 != (char *)0x0 && (local_448.m_f5 == (char *)0x0)))) {
        MPSInput::insertName(&local_448,"_RNG_",false);
      }
      if (((local_448.m_f1 == (char *)0x0) || (local_448.m_f2 == (char *)0x0)) ||
         (local_448.m_f3 == (char *)0x0)) goto LAB_0020f31b;
      if (colname[0] == '\0') {
        spxSnprintf(colname,0x100,"%s");
      }
      iVar9 = strcmp(colname,local_448.m_f1);
      if (iVar9 == 0) {
        uVar10 = NameSet::number(pNVar17,local_448.m_f2);
        if ((int)uVar10 < 0) {
          MPSInput::entryIgnored(&local_448,"Range",local_448.m_f1,"row",local_448.m_f2);
        }
        else {
          dVar5 = atof(local_448.m_f3);
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    ((cpp_dec_float<50u,int,void> *)&old_verbosity,dVar5);
          pnVar14 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&val.m_backend,-*pdVar11,(type *)0x0);
          tVar8 = boost::multiprecision::operator>
                            (pnVar14 + uVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&val.m_backend);
          if (tVar8) {
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,*pdVar11,(type *)0x0);
            tVar8 = boost::multiprecision::operator<
                              (pnVar14 + uVar10,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&old_verbosity_1);
            if (tVar8) {
              val.m_backend.data._M_elems._0_8_ =
                   val.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
              tVar8 = boost::multiprecision::operator>=
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&old_verbosity,(int *)&val.m_backend);
              pSVar13 = local_5a8;
              if (tVar8) {
                pSVar13 = local_6c0;
              }
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                        (&(((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                             *)&pSVar13->_vptr_SPxOut)->
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend,
                         (cpp_dec_float<50U,_int,_void> *)&old_verbosity);
              goto LAB_0020ef6c;
            }
          }
          pnVar14 = (this->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).left.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pdVar11 = (double *)infinity();
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (&val.m_backend,-*pdVar11,(type *)0x0);
          tVar8 = boost::multiprecision::operator>
                            (pnVar14 + uVar10,
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&val.m_backend);
          if (tVar8) {
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            vec.theelem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)CONCAT44(uStack_69c,uStack_6a0);
            vec._vptr_DSVectorBase = _old_verbosity;
            vec.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .m_elem = pNStack_6b0;
            vec.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memsize = (int)local_6a8;
            vec.
            super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .memused = local_6a8._4_4_;
            boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((type *)&old_verbosity_1,(multiprecision *)&vec,arg);
            val.m_backend.fpclass = cpp_dec_float_finite;
            val.m_backend.prec_elem = 10;
            val.m_backend.data._M_elems[0] = 0;
            val.m_backend.data._M_elems[1] = 0;
            val.m_backend.data._M_elems[2] = 0;
            val.m_backend.data._M_elems[3] = 0;
            val.m_backend.data._M_elems[4] = 0;
            val.m_backend.data._M_elems[5] = 0;
            val.m_backend.data._M_elems[6] = 0;
            val.m_backend.data._M_elems[7] = 0;
            val.m_backend.data._M_elems._32_5_ = 0;
            val.m_backend.data._M_elems[9]._1_3_ = 0;
            val.m_backend.exp = 0;
            val.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&val.m_backend,&pnVar14[uVar10].m_backend,
                       (cpp_dec_float<50U,_int,_void> *)&old_verbosity_1);
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          else {
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).right.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uStack_50 = CONCAT44(uStack_69c,uStack_6a0);
            local_68 = _old_verbosity;
            pNStack_60 = pNStack_6b0;
            local_58 = (int)local_6a8;
            iStack_54 = local_6a8._4_4_;
            local_48 = CONCAT35(uStack_693,_local_698);
            local_40 = local_690;
            local_3c = local_68c;
            local_38 = (fpclass_type)local_688;
            iStack_34 = local_688._4_4_;
            boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((type *)&old_verbosity_1,(multiprecision *)&local_68,arg);
            val.m_backend.fpclass = cpp_dec_float_finite;
            val.m_backend.prec_elem = 10;
            val.m_backend.data._M_elems[0] = 0;
            val.m_backend.data._M_elems[1] = 0;
            val.m_backend.data._M_elems[2] = 0;
            val.m_backend.data._M_elems[3] = 0;
            val.m_backend.data._M_elems[4] = 0;
            val.m_backend.data._M_elems[5] = 0;
            val.m_backend.data._M_elems[6] = 0;
            val.m_backend.data._M_elems[7] = 0;
            val.m_backend.data._M_elems._32_5_ = 0;
            val.m_backend.data._M_elems[9]._1_3_ = 0;
            val.m_backend.exp = 0;
            val.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      (&val.m_backend,&pnVar14[uVar10].m_backend,
                       (cpp_dec_float<50U,_int,_void> *)&old_verbosity_1);
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          *(ulong *)(pnVar14[uVar10].m_backend.data._M_elems + 8) =
               CONCAT35(val.m_backend.data._M_elems[9]._1_3_,val.m_backend.data._M_elems._32_5_);
          puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
          *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
          *(ulong *)(puVar1 + 2) =
               CONCAT44(val.m_backend.data._M_elems[7],val.m_backend.data._M_elems[6]);
          *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
          *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
               val.m_backend.data._M_elems._8_8_;
          pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
          pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
          pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
          pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
        }
LAB_0020ef6c:
        if (local_448.m_f5 != (char *)0x0) {
          uVar10 = NameSet::number(pNVar17,local_448.m_f4);
          if (-1 < (int)uVar10) {
            dVar5 = atof(local_448.m_f5);
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&old_verbosity,dVar5);
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&val.m_backend,-*pdVar11,(type *)0x0);
            tVar8 = boost::multiprecision::operator>
                              (pnVar14 + uVar10,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&val.m_backend);
            if (tVar8) {
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        ((cpp_dec_float<50U,_int,_void> *)&old_verbosity_1,*pdVar11,(type *)0x0);
              tVar8 = boost::multiprecision::operator<
                                (pnVar14 + uVar10,
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&old_verbosity_1);
              if (tVar8) {
                val.m_backend.data._M_elems._0_8_ =
                     val.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
                tVar8 = boost::multiprecision::operator>=
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&old_verbosity,(int *)&val.m_backend);
                pSVar13 = local_5a8;
                if (tVar8) {
                  pSVar13 = local_6c0;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&(((vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               *)&pSVar13->_vptr_SPxOut)->
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar10].m_backend,
                           (cpp_dec_float<50U,_int,_void> *)&old_verbosity);
                goto LAB_0020eb9a;
              }
            }
            pnVar14 = (this->
                      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).left.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&val.m_backend,-*pdVar11,(type *)0x0);
            tVar8 = boost::multiprecision::operator>
                              (pnVar14 + uVar10,
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&val.m_backend);
            if (tVar8) {
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uStack_90 = CONCAT44(uStack_69c,uStack_6a0);
              local_a8 = _old_verbosity;
              pNStack_a0 = pNStack_6b0;
              local_98 = (int)local_6a8;
              iStack_94 = local_6a8._4_4_;
              local_88 = CONCAT35(uStack_693,_local_698);
              local_80 = local_690;
              local_7c = local_68c;
              local_78 = (fpclass_type)local_688;
              iStack_74 = local_688._4_4_;
              boost::multiprecision::
              abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        ((type *)&old_verbosity_1,(multiprecision *)&local_a8,arg_00);
              val.m_backend.fpclass = cpp_dec_float_finite;
              val.m_backend.prec_elem = 10;
              val.m_backend.data._M_elems[0] = 0;
              val.m_backend.data._M_elems[1] = 0;
              val.m_backend.data._M_elems[2] = 0;
              val.m_backend.data._M_elems[3] = 0;
              val.m_backend.data._M_elems[4] = 0;
              val.m_backend.data._M_elems[5] = 0;
              val.m_backend.data._M_elems[6] = 0;
              val.m_backend.data._M_elems[7] = 0;
              val.m_backend.data._M_elems._32_5_ = 0;
              val.m_backend.data._M_elems[9]._1_3_ = 0;
              val.m_backend.exp = 0;
              val.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_add_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&val.m_backend,&pnVar14[uVar10].m_backend,
                         (cpp_dec_float<50U,_int,_void> *)&old_verbosity_1);
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).right.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uStack_d0 = CONCAT44(uStack_69c,uStack_6a0);
              local_e8 = _old_verbosity;
              pNStack_e0 = pNStack_6b0;
              local_d8 = (int)local_6a8;
              iStack_d4 = local_6a8._4_4_;
              local_c8 = CONCAT35(uStack_693,_local_698);
              local_c0 = local_690;
              local_bc = local_68c;
              local_b8 = (fpclass_type)local_688;
              iStack_b4 = local_688._4_4_;
              boost::multiprecision::
              abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        ((type *)&old_verbosity_1,(multiprecision *)&local_e8,arg_00);
              val.m_backend.fpclass = cpp_dec_float_finite;
              val.m_backend.prec_elem = 10;
              val.m_backend.data._M_elems[0] = 0;
              val.m_backend.data._M_elems[1] = 0;
              val.m_backend.data._M_elems[2] = 0;
              val.m_backend.data._M_elems[3] = 0;
              val.m_backend.data._M_elems[4] = 0;
              val.m_backend.data._M_elems[5] = 0;
              val.m_backend.data._M_elems[6] = 0;
              val.m_backend.data._M_elems[7] = 0;
              val.m_backend.data._M_elems._32_5_ = 0;
              val.m_backend.data._M_elems[9]._1_3_ = 0;
              val.m_backend.exp = 0;
              val.m_backend.neg = false;
              boost::multiprecision::default_ops::
              eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        (&val.m_backend,&pnVar14[uVar10].m_backend,
                         (cpp_dec_float<50U,_int,_void> *)&old_verbosity_1);
              pnVar14 = (this->
                        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).left.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            }
            *(ulong *)(pnVar14[uVar10].m_backend.data._M_elems + 8) =
                 CONCAT35(val.m_backend.data._M_elems[9]._1_3_,val.m_backend.data._M_elems._32_5_);
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT44(val.m_backend.data._M_elems[7],val.m_backend.data._M_elems[6]);
            *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                 val.m_backend.data._M_elems._8_8_;
            pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
            pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
            pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
            pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
            goto LAB_0020eb9a;
          }
          MPSInput::entryIgnored(&local_448,"Range",local_448.m_f1,"row",local_448.m_f4);
        }
      }
      goto LAB_0020eb9a;
    }
LAB_0020f31b:
    MPSInput::syntaxError(&local_448);
  }
LAB_0020f32f:
  pNVar17 = local_710;
  if (local_448.m_section == BOUNDS) {
    local_6c0 = this->spxout;
    DIdxSet::DIdxSet((DIdxSet *)&old_verbosity_1,8);
    memset(colname,0,0x100);
    local_688._0_4_ = cpp_dec_float_finite;
    local_688._4_4_ = 10;
    _old_verbosity = (_func_int **)0x0;
    pNStack_6b0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x0;
    local_6a8._0_4_ = 0;
    local_6a8._4_4_ = 0;
    uStack_6a0 = 0;
    uStack_69c = 0;
    _local_698 = 0;
    uStack_693 = 0;
    local_690 = 0;
    local_68c = false;
LAB_0020f3ad:
    bVar7 = MPSInput::readLine(&local_448);
    pSVar15 = local_6c0;
    if (bVar7) {
      if (local_448.m_f0 != (char *)0x0) {
        if ((local_6c0 != (SPxOut *)0x0) && (3 < (int)local_6c0->m_verbosity)) {
          val.m_backend.data._M_elems[0] = local_6c0->m_verbosity;
          vec._vptr_DSVectorBase = (_func_int **)CONCAT44(vec._vptr_DSVectorBase._4_4_,4);
          (*local_6c0->_vptr_SPxOut[2])(local_6c0);
          pSVar13 = soplex::operator<<(pSVar15,"IMPSRD05 Bound name     : ");
          pSVar13 = soplex::operator<<(pSVar13,colname);
          std::endl<char,std::char_traits<char>>(pSVar13->m_streams[pSVar13->m_verbosity]);
          (*pSVar15->_vptr_SPxOut[2])(pSVar15,&val);
        }
        iVar9 = strcmp(local_448.m_f0,"ENDATA");
        if (iVar9 == 0) {
          local_448.m_section = ENDATA;
          goto LAB_0020fa59;
        }
        goto switchD_0020f726_caseD_4e;
      }
      cVar2 = *local_448.m_f1;
      pcVar16 = local_448.m_f3;
      pcVar6 = local_448.m_f2;
      if (cVar2 == 'F') {
        if (local_448.m_f1[1] == 'X') goto LAB_0020f40e;
      }
      else if (cVar2 == 'U') {
        if ((local_448.m_f1[1] == 'I') || (local_448.m_f1[1] == 'P')) goto LAB_0020f40e;
      }
      else if ((cVar2 == 'L') && ((local_448.m_f1[1] == 'I' || (local_448.m_f1[1] == 'O')))) {
LAB_0020f40e:
        if (local_448.m_f1[2] == '\0') {
          pcVar16 = local_448.m_f4;
          pcVar6 = local_448.m_f3;
        }
      }
      if ((((pcVar6 != (char *)0x0) && (pcVar16 == (char *)0x0)) &&
          (MPSInput::insertName(&local_448,"_BND_",true), local_448.m_f1 == (char *)0x0)) ||
         ((local_448.m_f2 == (char *)0x0 || (local_448.m_f3 == (char *)0x0))))
      goto switchD_0020f726_caseD_4e;
      if (colname[0] == '\0') {
        spxSnprintf(colname,0x100,"%s");
      }
      iVar9 = strcmp(colname,local_448.m_f2);
      if (iVar9 == 0) {
        uVar10 = NameSet::number(pNVar17,local_448.m_f3);
        pcVar16 = local_448.m_f4;
        if (-1 < (int)uVar10) {
          if (local_448.m_f4 == (char *)0x0) {
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&old_verbosity,0.0);
          }
          else {
            iVar9 = strcmp(local_448.m_f4,"-Inf");
            if ((iVar9 == 0) || (iVar9 = strcmp(pcVar16,"-inf"), iVar9 == 0)) {
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (&val.m_backend,-*pdVar11,(type *)0x0);
            }
            else {
              iVar9 = strcmp(pcVar16,"Inf");
              if ((((iVar9 != 0) && (iVar9 = strcmp(pcVar16,"inf"), iVar9 != 0)) &&
                  (iVar9 = strcmp(pcVar16,"+Inf"), iVar9 != 0)) &&
                 (iVar9 = strcmp(pcVar16,"+inf"), iVar9 != 0)) {
                dVar5 = atof(pcVar16);
                boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                          ((cpp_dec_float<50u,int,void> *)&old_verbosity,dVar5);
                goto LAB_0020f65e;
              }
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (&val.m_backend,*pdVar11,(type *)0x0);
            }
            _local_698 = val.m_backend.data._M_elems._32_5_;
            uStack_693 = val.m_backend.data._M_elems[9]._1_3_;
            local_6a8._0_4_ = val.m_backend.data._M_elems[4];
            local_6a8._4_4_ = val.m_backend.data._M_elems[5];
            uStack_6a0 = val.m_backend.data._M_elems[6];
            uStack_69c = val.m_backend.data._M_elems[7];
            _old_verbosity = (_func_int **)val.m_backend.data._M_elems._0_8_;
            pNStack_6b0 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)val.m_backend.data._M_elems._8_8_;
            local_690 = val.m_backend.exp;
            local_68c = val.m_backend.neg;
            local_688._0_4_ = val.m_backend.fpclass;
            local_688._4_4_ = val.m_backend.prec_elem;
          }
LAB_0020f65e:
          if (local_448.m_f1[1] == 'I') {
            if (local_6c8 != (DIdxSet *)0x0) {
              DIdxSet::addIdx(local_6c8,uVar10);
            }
            iVar9 = IdxSet::pos((IdxSet *)&old_verbosity_1,uVar10);
            if (iVar9 < 0) {
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (&val.m_backend,*pdVar11,(type *)0x0);
              pnVar14 = (this->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)(pnVar14[uVar10].m_backend.data._M_elems + 8) =
                   CONCAT35(val.m_backend.data._M_elems[9]._1_3_,val.m_backend.data._M_elems._32_5_)
              ;
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT44(val.m_backend.data._M_elems[7],val.m_backend.data._M_elems[6]);
              *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
              *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                   val.m_backend.data._M_elems._8_8_;
              pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
              pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
              pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
              pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
              DIdxSet::addIdx((DIdxSet *)&old_verbosity_1,uVar10);
            }
          }
          cVar2 = *local_448.m_f1;
          switch(cVar2) {
          case 'L':
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            break;
          case 'M':
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&val.m_backend,-*pdVar11,(type *)0x0);
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            goto LAB_0020f863;
          case 'N':
          case 'O':
          case 'Q':
          case 'R':
          case 'S':
          case 'T':
            goto switchD_0020f726_caseD_4e;
          case 'P':
            pdVar11 = (double *)infinity();
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&val.m_backend,*pdVar11,(type *)0x0);
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
LAB_0020f863:
            *(ulong *)(pnVar14[uVar10].m_backend.data._M_elems + 8) =
                 CONCAT35(val.m_backend.data._M_elems[9]._1_3_,val.m_backend.data._M_elems._32_5_);
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
            *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
            *(ulong *)(puVar1 + 2) =
                 CONCAT44(val.m_backend.data._M_elems[7],val.m_backend.data._M_elems[6]);
            *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
            *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                 val.m_backend.data._M_elems._8_8_;
            pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
            pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
            pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
            pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
            goto LAB_0020f3ad;
          case 'U':
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            break;
          default:
            if (cVar2 == 'B') {
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)
                         ((this->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).low.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar10),0.0);
              boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                        ((cpp_dec_float<50u,int,void> *)
                         ((this->
                          super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).up.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar10),1.0);
              if (local_6c8 != (DIdxSet *)0x0) {
                DIdxSet::addIdx(local_6c8,uVar10);
              }
              goto LAB_0020f3ad;
            }
            if (cVar2 != 'F') goto switchD_0020f726_caseD_4e;
            if (local_448.m_f1[1] != 'X') {
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (&val.m_backend,-*pdVar11,(type *)0x0);
              pnVar4 = (this->
                       super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).low.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)(pnVar4[uVar10].m_backend.data._M_elems + 8) =
                   CONCAT35(val.m_backend.data._M_elems[9]._1_3_,val.m_backend.data._M_elems._32_5_)
              ;
              puVar1 = pnVar4[uVar10].m_backend.data._M_elems + 4;
              *puVar1 = val.m_backend.data._M_elems[4];
              puVar1[1] = val.m_backend.data._M_elems[5];
              puVar1[2] = val.m_backend.data._M_elems[6];
              puVar1[3] = val.m_backend.data._M_elems[7];
              pnVar14 = pnVar4 + uVar10;
              (pnVar14->m_backend).data._M_elems[0] = val.m_backend.data._M_elems[0];
              (pnVar14->m_backend).data._M_elems[1] = val.m_backend.data._M_elems[1];
              (pnVar14->m_backend).data._M_elems[2] = val.m_backend.data._M_elems[2];
              (pnVar14->m_backend).data._M_elems[3] = val.m_backend.data._M_elems[3];
              pnVar4[uVar10].m_backend.exp = val.m_backend.exp;
              pnVar4[uVar10].m_backend.neg = val.m_backend.neg;
              pnVar4[uVar10].m_backend.fpclass = val.m_backend.fpclass;
              pnVar4[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
              pdVar11 = (double *)infinity();
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                        (&val.m_backend,*pdVar11,(type *)0x0);
              pnVar14 = (this->
                        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ).up.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              *(ulong *)(pnVar14[uVar10].m_backend.data._M_elems + 8) =
                   CONCAT35(val.m_backend.data._M_elems[9]._1_3_,val.m_backend.data._M_elems._32_5_)
              ;
              puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
              *(undefined8 *)puVar1 = val.m_backend.data._M_elems._16_8_;
              *(ulong *)(puVar1 + 2) =
                   CONCAT44(val.m_backend.data._M_elems[7],val.m_backend.data._M_elems[6]);
              *(undefined8 *)&pnVar14[uVar10].m_backend.data = val.m_backend.data._M_elems._0_8_;
              *(undefined8 *)(pnVar14[uVar10].m_backend.data._M_elems + 2) =
                   val.m_backend.data._M_elems._8_8_;
              pnVar14[uVar10].m_backend.exp = val.m_backend.exp;
              pnVar14[uVar10].m_backend.neg = val.m_backend.neg;
              pnVar14[uVar10].m_backend.fpclass = val.m_backend.fpclass;
              pnVar14[uVar10].m_backend.prec_elem = val.m_backend.prec_elem;
              goto LAB_0020f3ad;
            }
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).low.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            *(ulong *)(pnVar14[uVar10].m_backend.data._M_elems + 8) =
                 CONCAT35(uStack_693,_local_698);
            puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
            puVar1[0] = (int)local_6a8;
            puVar1[1] = local_6a8._4_4_;
            *(ulong *)(puVar1 + 2) = CONCAT44(uStack_69c,uStack_6a0);
            *(_func_int ***)&pnVar14[uVar10].m_backend.data = _old_verbosity;
            *(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              **)(pnVar14[uVar10].m_backend.data._M_elems + 2) = pNStack_6b0;
            pnVar14[uVar10].m_backend.exp = local_690;
            pnVar14[uVar10].m_backend.neg = local_68c;
            pnVar14[uVar10].m_backend.fpclass = (fpclass_type)local_688;
            pnVar14[uVar10].m_backend.prec_elem = local_688._4_4_;
            pnVar14 = (this->
                      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ).up.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          *(ulong *)(pnVar14[uVar10].m_backend.data._M_elems + 8) = CONCAT35(uStack_693,_local_698);
          puVar1 = pnVar14[uVar10].m_backend.data._M_elems + 4;
          puVar1[0] = (int)local_6a8;
          puVar1[1] = local_6a8._4_4_;
          *(ulong *)(puVar1 + 2) = CONCAT44(uStack_69c,uStack_6a0);
          *(_func_int ***)&pnVar14[uVar10].m_backend.data = _old_verbosity;
          *(Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            **)(pnVar14[uVar10].m_backend.data._M_elems + 2) = pNStack_6b0;
          pnVar14[uVar10].m_backend.exp = local_690;
          pnVar14[uVar10].m_backend.neg = local_68c;
          pnVar14[uVar10].m_backend.fpclass = (fpclass_type)local_688;
          pnVar14[uVar10].m_backend.prec_elem = local_688._4_4_;
          goto LAB_0020f3ad;
        }
        MPSInput::entryIgnored(&local_448,"column",local_448.m_f3,"bound",colname);
      }
      goto LAB_0020f3ad;
    }
switchD_0020f726_caseD_4e:
    MPSInput::syntaxError(&local_448);
LAB_0020fa59:
    DIdxSet::~DIdxSet((DIdxSet *)&old_verbosity_1);
  }
  if (local_448.m_section != ENDATA) {
    MPSInput::syntaxError(&local_448);
  }
  if (local_448.m_has_error == true) {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x1b])();
  }
  else {
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x45])
              (this,(ulong)(((local_448.m_objsense != MINIMIZE) - 1) +
                           (uint)(local_448.m_objsense != MINIMIZE)));
    pSVar15 = this->spxout;
    if ((pSVar15 != (SPxOut *)0x0) && (VVar3 = pSVar15->m_verbosity, 3 < (int)VVar3)) {
      colname[0] = (char)VVar3;
      colname[1] = (char)(VVar3 >> 8);
      colname[2] = (char)(VVar3 >> 0x10);
      colname[3] = (char)(VVar3 >> 0x18);
      _old_verbosity = (_func_int **)CONCAT44(uStack_6b4,4);
      (*pSVar15->_vptr_SPxOut[2])();
      pSVar15 = soplex::operator<<(this->spxout,"IMPSRD06 Objective sense: ");
      pcVar16 = "Maximize\n";
      if (local_448.m_objsense == MINIMIZE) {
        pcVar16 = "Minimize\n";
      }
      soplex::operator<<(pSVar15,pcVar16);
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,colname);
    }
    added2Set(this,(SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)this,
              &local_5b0->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ,(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x51])
              (this,(ulong)(uint)(this->
                                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).
                                 super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .set.thenum);
  }
  if (local_5a0 == (NameSet *)0x0) {
    NameSet::~NameSet(local_710);
    free(local_710);
    local_710 = (NameSet *)0x0;
  }
  if (p_rnames == (NameSet *)0x0) {
    NameSet::~NameSet(local_708);
    free(local_708);
  }
  return (bool)(local_448.m_has_error ^ 1);
}

Assistant:

inline
bool SPxLPBase<R>::readMPS(
   std::istream& p_input,           ///< input stream.
   NameSet*      p_rnames,          ///< row names.
   NameSet*      p_cnames,          ///< column names.
   DIdxSet*      p_intvars)         ///< integer variables.
{
   LPRowSetBase<R>& rset = *this;
   LPColSetBase<R>& cset = *this;
   NameSet* rnames;
   NameSet* cnames;

   if(p_cnames)
      cnames = p_cnames;
   else
   {
      cnames = nullptr;
      spx_alloc(cnames);
      cnames = new(cnames) NameSet();
   }

   cnames->clear();

   if(p_rnames)
      rnames = p_rnames;
   else
   {
      try
      {
         rnames = nullptr;
         spx_alloc(rnames);
         rnames = new(rnames) NameSet();
      }
      catch(const SPxMemoryException& x)
      {
         if(!p_cnames)
         {
            cnames->~NameSet();
            spx_free(cnames);
         }

         throw x;
      }
   }

   rnames->clear();

   SPxLPBase<R>::clear(); // clear the LP.

   cset.memRemax(Init_NZos);
   cset.reMax(Init_Cols);

   MPSInput mps(p_input);

   MPSreadName(mps, spxout);

   if(mps.section() == MPSInput::OBJSEN)
      MPSreadObjsen(mps);

   if(mps.section() == MPSInput::OBJNAME)
      MPSreadObjname(mps);

   if(mps.section() == MPSInput::ROWS)
      MPSreadRows(mps, rset, *rnames, spxout);

   addedRows(rset.num());

   if(mps.section() == MPSInput::COLUMNS)
      MPSreadCols(mps, rset, *rnames, cset, *cnames, p_intvars);

   if(mps.section() == MPSInput::RHS)
      MPSreadRhs(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::RANGES)
      MPSreadRanges(mps, rset, *rnames, spxout);

   if(mps.section() == MPSInput::BOUNDS)
      MPSreadBounds(mps, cset, *cnames, p_intvars, spxout);

   if(mps.section() != MPSInput::ENDATA)
      mps.syntaxError();

   if(mps.hasError())
      clear();
   else
   {
      changeSense(mps.objSense() == MPSInput::MINIMIZE ? SPxLPBase<R>::MINIMIZE : SPxLPBase<R>::MAXIMIZE);

      SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD06 Objective sense: " << ((mps.objSense() ==
                    MPSInput::MINIMIZE) ? "Minimize\n" : "Maximize\n"));

      added2Set(
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPRowSetBase<R>*>(this))),
         *(reinterpret_cast<SVSetBase<R>*>(static_cast<LPColSetBase<R>*>(this))),
         cset.num());
      addedCols(cset.num());

      assert(isConsistent());
   }

   if(p_cnames == nullptr)
   {
      cnames->~NameSet();
      spx_free(cnames);
   }

   if(p_rnames == nullptr)
   {
      rnames->~NameSet();
      spx_free(rnames);
   }

   return !mps.hasError();
}